

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlTextReaderPtr xmlReaderWalker(xmlDocPtr doc)

{
  xmlTextReaderPtr __s;
  xmlDictPtr pxVar1;
  
  if ((doc != (xmlDocPtr)0x0) &&
     (__s = (xmlTextReaderPtr)(*xmlMalloc)(0x160), __s != (xmlTextReaderPtr)0x0)) {
    memset(__s,0,0x160);
    __s->allocs = 2;
    __s->doc = doc;
    pxVar1 = xmlDictCreate();
    __s->dict = pxVar1;
    return __s;
  }
  return (xmlTextReaderPtr)0x0;
}

Assistant:

xmlTextReaderPtr
xmlReaderWalker(xmlDocPtr doc)
{
    xmlTextReaderPtr ret;

    if (doc == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(xmlTextReader));
    if (ret == NULL) {
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlTextReader));
    ret->entNr = 0;
    ret->input = NULL;
    ret->mode = XML_TEXTREADER_MODE_INITIAL;
    ret->node = NULL;
    ret->curnode = NULL;
    ret->base = 0;
    ret->cur = 0;
    ret->allocs = XML_TEXTREADER_CTXT;
    ret->doc = doc;
    ret->state = XML_TEXTREADER_START;
    ret->dict = xmlDictCreate();
    return(ret);
}